

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alcmain.h
# Opt level: O2

ALuint __thiscall ALCdevice::channelsFromFmt(ALCdevice *this)

{
  uint uVar1;
  
  uVar1 = ChannelsFromDevFmt(this->FmtChans,this->mAmbiOrder);
  return uVar1;
}

Assistant:

ALuint channelsFromFmt() const noexcept { return ChannelsFromDevFmt(FmtChans, mAmbiOrder); }